

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
internal_huf_decompress
          (exr_decode_pipeline_t *decode,uint8_t *compressed,uint64_t nCompressed,uint16_t *raw,
          uint64_t nRaw,void *spare,uint64_t sparebytes)

{
  byte *pbVar1;
  ulong *puVar2;
  long *plVar3;
  byte bVar4;
  uint iM;
  void *ptr;
  int i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  byte bVar10;
  uint uVar11;
  char *pcVar12;
  uint64_t *freq;
  long lVar13;
  _internal_exr_context *pctxt;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  int iVar23;
  byte *pbVar24;
  bool bVar25;
  int iVar27;
  double dVar26;
  long lVar28;
  undefined1 auVar29 [16];
  uint64_t offset [59];
  size_t codeCount [59];
  uint64_t base [59];
  byte *local_808;
  double local_7b0 [61];
  long local_5c8;
  int local_5c0 [118];
  undefined1 local_3e8 [480];
  ulong local_208 [59];
  
  if (decode == (exr_decode_pipeline_t *)0x0) {
    pctxt = (_internal_exr_context *)0x0;
  }
  else {
    pctxt = (_internal_exr_context *)decode->context;
  }
  if (nCompressed < 0x14) {
    iVar23 = (uint)(nRaw != 0) * 3;
  }
  else {
    iVar23 = 3;
    if (sparebytes == 0xc0008) {
      uVar15 = *(uint *)compressed;
      iVar23 = 0x17;
      if (uVar15 < 0x10001) {
        iM = *(uint *)(compressed + 4);
        uVar6 = (ulong)iM;
        if (iM < 0x10001) {
          uVar16 = *(uint *)(compressed + 0xc);
          uVar20 = (ulong)uVar16;
          local_7b0[0] = (double)(uVar20 + 7 >> 3);
          iVar23 = 1;
          if ((long)local_7b0[0] + 0x14U <= nCompressed) {
            pbVar1 = compressed + 0x14;
            if (uVar16 < 0x81) {
              pbVar21 = (byte *)(nCompressed - 0x14);
              uVar16 = 0;
              memset(spare,0,0xc0008);
              pbVar19 = pbVar1;
              if (uVar15 <= iM) {
                uVar6 = (ulong)(iM + 1);
                uVar22 = 0;
                pbVar24 = pbVar1;
                uVar11 = uVar15;
                do {
                  if ((uVar16 < 6) && (pbVar19 = pbVar1, pbVar21 <= pbVar24 + -(long)pbVar1))
                  goto LAB_0010fef2;
                  if (uVar16 < 6) {
                    uVar16 = uVar16 | 8;
                    uVar22 = uVar22 << 8 | (ulong)*pbVar24;
                    pbVar24 = pbVar24 + 1;
                  }
                  uVar17 = uVar16 - 6;
                  uVar14 = (uint)(uVar22 >> ((byte)uVar17 & 0x3f)) & 0x3f;
                  uVar8 = (ulong)uVar14;
                  uVar7 = (ulong)uVar11;
                  *(ulong *)((long)spare + uVar7 * 8) = uVar8;
                  if (uVar8 == 0x3f) {
                    if ((7 < uVar17) || (pbVar24 + -(long)pbVar1 < pbVar21)) {
                      if (uVar17 < 8) {
                        uVar17 = uVar16 + 2;
                        uVar22 = uVar22 << 8 | (ulong)*pbVar24;
                        pbVar24 = pbVar24 + 1;
                      }
                      uVar17 = uVar17 - 8;
                      uVar8 = uVar22 >> ((byte)uVar17 & 0x3f) & 0xff;
                      uVar7 = uVar8 + uVar7 + 6;
                      if (uVar7 <= uVar6) {
                        lVar5 = uVar8 + 6;
                        uVar16 = uVar11;
                        do {
                          uVar11 = uVar16;
                          *(undefined8 *)((long)spare + (ulong)uVar11 * 8) = 0;
                          lVar5 = lVar5 + -1;
                          uVar16 = uVar11 + 1;
                        } while (lVar5 != 0);
                      }
LAB_0010fec7:
                      uVar16 = uVar17;
                      if (uVar7 <= uVar6) goto LAB_0010fed0;
                    }
                    uVar16 = uVar17;
                    bVar25 = false;
                  }
                  else {
                    uVar16 = uVar17;
                    if (0x3a < uVar14) {
                      uVar7 = (uVar8 + uVar7) - 0x39;
                      if (uVar7 <= uVar6) {
                        for (lVar5 = uVar8 - 0x39; lVar5 != 0; lVar5 = lVar5 + -1) {
                          *(undefined8 *)((long)spare + (ulong)uVar11 * 8) = 0;
                          uVar11 = uVar11 + 1;
                        }
                        uVar11 = uVar11 - 1;
                      }
                      goto LAB_0010fec7;
                    }
LAB_0010fed0:
                    bVar25 = true;
                  }
                  pbVar19 = pbVar1;
                  if (!bVar25) goto LAB_0010fef2;
                  uVar11 = uVar11 + 1;
                  pbVar19 = pbVar24;
                } while (uVar11 <= iM);
              }
              pbVar21 = pbVar1 + ((long)pbVar21 - (long)pbVar19);
              hufCanonicalCodeTable((uint64_t *)spare);
              pbVar24 = pbVar19;
LAB_0010fef2:
              iVar23 = (int)pbVar24;
              if (uVar20 <= (ulong)((long)pbVar21 << 3)) {
                iVar23 = hufBuildDecTable((uint64_t *)spare,uVar15,iM,
                                          (HufDec *)((long)spare + 0x80008));
                if (iVar23 == 0) {
                  iVar23 = hufDecode((uint64_t *)spare,(HufDec *)((long)spare + 0x80008),pbVar19,
                                     uVar20,iM,nRaw,raw);
                }
                lVar5 = 0;
                do {
                  ptr = *(void **)((long)spare + lVar5 + 0x80010);
                  if (ptr != (void *)0x0) {
                    internal_exr_free(ptr);
                    *(undefined8 *)((long)spare + lVar5 + 0x80010) = 0;
                  }
                  lVar5 = lVar5 + 0x10;
                } while (lVar5 != 0x40000);
              }
              if ((ulong)((long)pbVar21 << 3) < uVar20) {
                return 0x17;
              }
            }
            else {
              *(uint *)spare = iM;
              *(undefined4 *)((long)spare + 4) = 0;
              *(undefined2 *)((long)spare + 8) = 0xff;
              memset(&local_5c8,0,0x1d8);
              memset(local_208,0xff,0x1d8);
              memset(local_7b0 + 1,0,0x1d8);
              local_808 = pbVar1;
              if (uVar15 <= iM) {
                iVar23 = 0;
                uVar22 = 0;
                pbVar19 = pbVar1;
                uVar20 = (ulong)uVar15;
                do {
                  if (pbVar1 + ((int)nCompressed + -0x14) <= pbVar19) {
                    if (pctxt != (_internal_exr_context *)0x0) {
                      (*pctxt->print_error)
                                (pctxt,0x17,"Error decoding Huffman table (Truncated table data).");
                    }
LAB_00110142:
                    iVar23 = 0x17;
                    goto LAB_00110426;
                  }
                  iVar27 = iVar23;
                  if (iVar23 < 6) {
                    do {
                      bVar10 = *pbVar19;
                      pbVar19 = pbVar19 + 1;
                      uVar22 = uVar22 << 8 | (ulong)bVar10;
                      iVar27 = iVar23 + 8;
                      bVar25 = iVar23 < -2;
                      iVar23 = iVar27;
                    } while (bVar25);
                  }
                  iVar23 = iVar27 + -6;
                  uVar11 = (uint)(uVar22 >> ((byte)iVar23 & 0x3f)) & 0x3f;
                  uVar7 = (ulong)uVar11;
                  if (uVar7 < 0x3b) {
                    if (uVar7 != 0) {
                      if (uVar11 < *(byte *)((long)spare + 8)) {
                        *(char *)((long)spare + 8) = (char)uVar11;
                      }
                      if (*(byte *)((long)spare + 9) < uVar11) {
                        *(char *)((long)spare + 9) = (char)uVar11;
                      }
                      (&local_5c8)[uVar7] = (&local_5c8)[uVar7] + 1;
                      goto LAB_0010fccf;
                    }
                    iVar27 = 7;
                  }
                  else if (uVar11 == 0x3f) {
                    if (pbVar19 < pbVar1 + ((int)nCompressed + -0x14)) {
                      if (iVar27 < 0xe) {
                        iVar27 = iVar27 + -0xe;
                        do {
                          iVar23 = iVar27;
                          bVar10 = *pbVar19;
                          pbVar19 = pbVar19 + 1;
                          uVar22 = (ulong)bVar10 | uVar22 << 8;
                          iVar27 = iVar23 + 8;
                        } while (iVar27 < 0);
                        iVar23 = iVar23 + 0x10;
                      }
                      iVar23 = iVar23 + -8;
                      uVar20 = uVar20 + (uVar22 >> ((byte)iVar23 & 0x3f) & 0xff) + 5;
                      goto LAB_0010fccf;
                    }
                    if (pctxt != (_internal_exr_context *)0x0) {
                      pcVar12 = "Error decoding Huffman table (Truncated table data).";
                      goto LAB_0010fcf7;
                    }
LAB_0010fd1c:
                    iVar27 = 1;
                  }
                  else {
                    uVar20 = (uVar20 + uVar7) - 0x3a;
LAB_0010fccf:
                    iVar27 = 0;
                    if (uVar6 < uVar20) {
                      if (pctxt == (_internal_exr_context *)0x0) goto LAB_0010fd1c;
                      pcVar12 = "Error decoding Huffman table (Run beyond end of table).";
LAB_0010fcf7:
                      (*pctxt->print_error)(pctxt,0x17,pcVar12);
                      iVar27 = 1;
                    }
                  }
                  if ((iVar27 != 7) && (iVar27 != 0)) goto LAB_00110142;
                  uVar20 = uVar20 + 1;
                } while (uVar20 <= uVar6);
              }
              iVar23 = *(int *)((long)spare + 4);
              iVar27 = 0;
              lVar5 = 0;
              do {
                iVar23 = iVar23 + (int)(&local_5c8)[lVar5];
                iVar27 = iVar27 + local_5c0[lVar5 * 2];
                lVar5 = lVar5 + 2;
              } while (lVar5 != 0x3a);
              *(int *)((long)spare + 4) = iVar27 + iVar23;
              if ((uint)(iVar27 + iVar23) < 0x10002) {
                bVar10 = *(byte *)((long)spare + 8);
                uVar22 = (ulong)bVar10;
                bVar4 = *(byte *)((long)spare + 9);
                uVar20 = (ulong)bVar4;
                if (bVar10 <= bVar4) {
                  lVar5 = uVar20 - uVar22;
                  uVar7 = uVar22;
                  do {
                    lVar13 = (&local_5c8)[uVar7];
                    auVar29._8_4_ = (int)((ulong)lVar13 >> 0x20);
                    auVar29._0_8_ = lVar13;
                    auVar29._12_4_ = 0x45300000;
                    local_7b0[uVar7 + 1] =
                         (double)(2L << ((byte)lVar5 & 0x3f)) *
                         ((auVar29._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0));
                    uVar7 = uVar7 + 1;
                    bVar25 = lVar5 != 0;
                    lVar5 = lVar5 + -1;
                  } while (bVar25);
                  if (bVar10 <= bVar4) {
                    uVar7 = uVar22;
                    do {
                      dVar26 = 0.0;
                      for (uVar8 = uVar7; uVar8 < uVar20; uVar8 = uVar8 + 1) {
                        dVar26 = dVar26 + local_7b0[uVar8 + 2];
                      }
                      uVar8 = uVar7 + 1;
                      dVar26 = ceil(dVar26 / (double)(2L << (bVar4 - (char)uVar7 & 0x3f)));
                      local_208[uVar7] =
                           (long)(dVar26 - 9.223372036854776e+18) & (long)dVar26 >> 0x3f |
                           (long)dVar26;
                      uVar7 = uVar8;
                    } while (uVar8 != uVar20 + 1);
                  }
                }
                local_7b0[uVar20 + 1] = 0.0;
                if (bVar10 < bVar4) {
                  dVar26 = local_7b0[uVar20 + 1];
                  do {
                    dVar26 = (double)((long)dVar26 + (&local_5c8)[uVar20]);
                    local_7b0[uVar20] = dVar26;
                    uVar20 = uVar20 - 1;
                  } while ((long)uVar22 < (long)uVar20);
                }
                memset(local_3e8,0xff,0x1d8);
                if (bVar10 <= bVar4) {
                  memcpy(local_208 + ((ulong)bVar10 - 0x3c),local_7b0 + (ulong)bVar10 + 1,
                         (ulong)((uint)bVar4 - (uint)bVar10) * 8 + 8);
                }
                if (uVar15 <= iM) {
                  iVar23 = 0;
                  uVar22 = 0;
                  uVar20 = (ulong)uVar15;
                  do {
                    iVar27 = iVar23;
                    if (iVar23 < 6) {
                      do {
                        bVar10 = *local_808;
                        local_808 = local_808 + 1;
                        uVar22 = uVar22 << 8 | (ulong)bVar10;
                        iVar23 = iVar27 + 8;
                        bVar25 = iVar27 < -2;
                        iVar27 = iVar23;
                      } while (bVar25);
                    }
                    iVar27 = iVar23 + -6;
                    uVar15 = (uint)(uVar22 >> ((byte)iVar27 & 0x3f)) & 0x3f;
                    uVar7 = (ulong)uVar15;
                    if (uVar7 < 0x3b) {
                      iVar23 = iVar27;
                      if (uVar7 == 0) {
                        iVar18 = 0x1f;
                      }
                      else {
                        uVar8 = local_208[uVar7 - 0x3c];
                        if (uVar8 < (ulong)(long)*(int *)((long)spare + 4)) {
                          *(int *)((long)spare + uVar8 * 4 + 0xc) = (int)uVar20;
                          local_208[uVar7 - 0x3c] = uVar8 + 1;
                          goto LAB_00110219;
                        }
                        iVar18 = 1;
                        if (pctxt != (_internal_exr_context *)0x0) {
                          (*pctxt->print_error)
                                    (pctxt,0x17,"Huffman decode error (Invalid symbol in header)");
                        }
                      }
                    }
                    else {
                      if (uVar15 == 0x3f) {
                        if (iVar23 < 0xe) {
                          iVar23 = iVar23 + -0xe;
                          do {
                            iVar27 = iVar23;
                            bVar10 = *local_808;
                            local_808 = local_808 + 1;
                            uVar22 = (ulong)bVar10 | uVar22 << 8;
                            iVar23 = iVar27 + 8;
                          } while (iVar23 < 0);
                          iVar27 = iVar27 + 0x10;
                        }
                        iVar27 = iVar27 + -8;
                        uVar20 = uVar20 + (uVar22 >> ((byte)iVar27 & 0x3f) & 0xff) + 5;
                      }
                      else {
                        uVar20 = (uVar20 + uVar7) - 0x3a;
                      }
LAB_00110219:
                      iVar18 = 0;
                      iVar23 = iVar27;
                    }
                    if ((iVar18 != 0x1f) && (iVar18 != 0)) {
                      iVar23 = 0x17;
                      local_808 = pbVar1;
                      goto LAB_00110426;
                    }
                    bVar25 = uVar20 < uVar6;
                    uVar20 = uVar20 + 1;
                  } while (bVar25);
                }
                bVar10 = 0;
                lVar5 = 0;
                do {
                  lVar13 = local_208[lVar5] << (bVar10 & 0x3f);
                  if (local_208[lVar5] == 0xffffffffffffffff) {
                    lVar13 = -1;
                  }
                  *(long *)((long)spare + lVar5 * 8 + 0x40010) = lVar13;
                  lVar5 = lVar5 + 1;
                  bVar10 = bVar10 - 1;
                } while (lVar5 != 0x3b);
                *(undefined8 *)((long)spare + 0x401e8) = 0;
                *(long *)((long)spare + 0x401f0) =
                     (long)local_7b0[1] - *(long *)((long)spare + 0x40010);
                lVar13 = 1;
                lVar28 = 2;
                lVar5 = 0;
                do {
                  dVar26 = local_7b0[lVar5 + 3];
                  puVar2 = (ulong *)((long)spare + lVar5 * 8 + 0x40018);
                  uVar6 = puVar2[1];
                  plVar3 = (long *)((long)spare + lVar5 * 8 + 0x401f8);
                  *plVar3 = (long)local_7b0[lVar5 + 2] - (*puVar2 >> 0x40 - lVar13);
                  plVar3[1] = (long)dVar26 - (uVar6 >> 0x40 - lVar28);
                  lVar5 = lVar5 + 2;
                  lVar13 = lVar13 + 2;
                  lVar28 = lVar28 + 2;
                } while (lVar5 != 0x3a);
                bVar10 = *(byte *)((long)spare + 8);
                bVar4 = *(byte *)((long)spare + 9);
                bVar25 = false;
                uVar6 = 0;
                do {
                  *(undefined4 *)((long)spare + uVar6 * 4 + 0x403c8) = 0xffff;
                  if (bVar10 <= bVar4) {
                    lVar5 = (ulong)bVar10 - 0x40;
                    uVar15 = (uint)bVar10 << 0x18;
                    do {
                      if (*(ulong *)((long)spare + lVar5 * 8 + 0x40210) <= uVar6 << 0x32) {
                        uVar20 = ((uVar6 << 0x32) >> (-(char)lVar5 & 0x3fU)) +
                                 *(long *)((long)spare + lVar5 * 8 + 0x403f0);
                        if ((ulong)(long)*(int *)((long)spare + 4) <= uVar20) {
                          if (pctxt != (_internal_exr_context *)0x0) {
                            (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Overrun)");
                          }
                          iVar23 = 0x17;
                          if (!bVar25) goto LAB_00110426;
                          goto LAB_001103d5;
                        }
                        *(uint *)((long)spare + uVar6 * 4 + 0x403c8) =
                             uVar15 | *(uint *)((long)spare + uVar20 * 4 + 0xc);
                        break;
                      }
                      uVar15 = uVar15 + 0x1000000;
                      lVar13 = lVar5 - (ulong)bVar4;
                      lVar5 = lVar5 + 1;
                    } while (lVar13 != -0x40);
                  }
                  bVar25 = 0x3ffe < uVar6;
                  uVar6 = uVar6 + 1;
                } while (uVar6 != 0x4000);
LAB_001103d5:
                uVar15 = 0xe;
                do {
                  if (*(long *)((long)spare + (ulong)uVar15 * 8 + 0x40010) != -1) goto LAB_001103f3;
                  bVar25 = 1 < uVar15;
                  uVar15 = uVar15 - 1;
                } while (bVar25);
                uVar15 = 0;
LAB_001103f3:
                if ((int)uVar15 < 0) {
                  uVar9 = 0xffffffffffffffff;
                }
                else {
                  uVar9 = *(undefined8 *)((long)spare + (ulong)uVar15 * 8 + 0x40010);
                }
                *(undefined8 *)((long)spare + 0x503c8) = uVar9;
                iVar23 = 0;
              }
              else if (pctxt == (_internal_exr_context *)0x0) {
                iVar23 = 0x17;
              }
              else {
                iVar23 = 0x17;
                (*pctxt->print_error)(pctxt,0x17,"Error decoding Huffman table (Too many symbols).")
                ;
              }
LAB_00110426:
              bVar25 = true;
              if (iVar23 == 0) {
                bVar25 = false;
                iVar23 = 0;
                if (local_808 + ((long)local_7b0[0] - (long)compressed) <= nCompressed) {
                  iVar23 = fasthuf_decode(pctxt,(FastHufDecoder *)spare,local_808,uVar16,raw,
                                          (int)nRaw);
                  bVar25 = true;
                }
              }
              if (!bVar25) {
                return 1;
              }
            }
          }
        }
      }
    }
  }
  return iVar23;
}

Assistant:

exr_result_t
internal_huf_decompress (
    exr_decode_pipeline_t* decode,
    const uint8_t*         compressed,
    uint64_t               nCompressed,
    uint16_t*              raw,
    uint64_t               nRaw,
    void*                  spare,
    uint64_t               sparebytes)
{
    uint32_t                            im, iM, nBits;
    uint64_t                            nBytes;
    const uint8_t*                      ptr;
    exr_result_t                        rv;
    const struct _internal_exr_context* pctxt = NULL;
    const uint64_t hufInfoBlockSize           = 5 * sizeof (uint32_t);

    if (decode) pctxt = EXR_CCTXT (decode->context);
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) return EXR_ERR_INVALID_ARGUMENT;
        return EXR_ERR_SUCCESS;
    }

    if (sparebytes != internal_exr_huf_decompress_spare_bytes ())
        return EXR_ERR_INVALID_ARGUMENT;

    im = readUInt (compressed);
    iM = readUInt (compressed + 4);
    // uint32_t tableLength = readUInt (compressed + 8);
    nBits = readUInt (compressed + 12);
    // uint32_t future = readUInt (compressed + 16);

    if (im >= HUF_ENCSIZE || iM >= HUF_ENCSIZE) return EXR_ERR_CORRUPT_CHUNK;

    ptr = compressed + hufInfoBlockSize;

    nBytes = (((uint64_t) (nBits) + 7)) / 8;

    // must be nBytes remaining in buffer
    if (hufInfoBlockSize + nBytes > nCompressed) return EXR_ERR_OUT_OF_MEMORY;

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //
    if (fasthuf_decode_enabled () && nBits > 128)
    {
        FastHufDecoder* fhd = (FastHufDecoder*) spare;

        rv = fasthuf_initialize (pctxt, fhd, &ptr, (int) (nCompressed - hufInfoBlockSize), im, iM, iM);
        if (rv == EXR_ERR_SUCCESS)
        {
            if ( (uint64_t)(ptr - compressed) + nBytes > nCompressed )
                return EXR_ERR_OUT_OF_MEMORY;
            rv = fasthuf_decode (pctxt, fhd, ptr, nBits, raw, (int) nRaw);
        }
    }
    else
    {
        uint64_t* freq     = (uint64_t*) spare;
        HufDec*   hdec     = (HufDec*) (freq + HUF_ENCSIZE);
        uint64_t  nLeft    = nCompressed - 20;

        hufClearDecTable (hdec);
        hufUnpackEncTable (&ptr, &nLeft, im, iM, freq);

        if (nBits > 8 * nLeft) return EXR_ERR_CORRUPT_CHUNK;

        rv = hufBuildDecTable (freq, im, iM, hdec);
        if (rv == EXR_ERR_SUCCESS)
            rv = hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);

        hufFreeDecTable (hdec);
    }
    return rv;
}